

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O0

wchar_t canGzip(void)

{
  wchar_t wVar1;
  
  if (canGzip::tested == L'\0') {
    canGzip::tested = L'\x01';
    wVar1 = systemf("gzip --help %s",redirectArgs);
    if (wVar1 == L'\0') {
      canGzip::value = L'\x01';
    }
  }
  return canGzip::value;
}

Assistant:

int
canGzip(void)
{
	static int tested = 0, value = 0;
	if (!tested) {
		tested = 1;
		if (systemf("gzip --help %s", redirectArgs) == 0)
			value = 1;
	}
	return (value);
}